

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_oct
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  uint uVar1;
  format_specs *pfVar2;
  undefined1 auVar3 [16];
  bin_writer<3> f;
  int num_digits;
  string_view prefix;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  auVar3._8_8_ = in_stack_ffffffffffffff80;
  auVar3._0_8_ = in_stack_ffffffffffffff78;
  num_digits = count_digits<3u,unsigned__int128>
                         (*(internal **)&this->abs_value,(unsigned___int128)auVar3);
  pfVar2 = this->specs;
  auVar3 = (undefined1  [16])this->abs_value;
  if (((char)pfVar2->field_0x9 < '\0') &&
     (((long)this->abs_value != 0 || *(long *)((long)&this->abs_value + 8) != 0) &&
      pfVar2->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  f._20_4_ = uStack_14;
  f.num_digits = num_digits;
  f.abs_value = (unsigned_type)auVar3;
  f._24_8_ = uStack_10;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *pfVar2,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }